

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

bool __thiscall absl::Mutex::AwaitWithDeadline(Mutex *this,Condition *cond,Time deadline)

{
  bool bVar1;
  KernelTimeout t;
  Time t_00;
  
  if ((cond->eval_ == (_func_bool_Condition_ptr *)0x0) || (bVar1 = (*cond->eval_)(cond), bVar1)) {
    AssertReaderHeld(this);
    return true;
  }
  t_00.rep_._12_4_ = 0;
  t_00.rep_.rep_hi_ = SUB128(deadline.rep_._0_12_,0);
  t_00.rep_.rep_lo_ = SUB124(deadline.rep_._0_12_,8);
  t.ns_ = synchronization_internal::KernelTimeout::MakeNs(t_00);
  bVar1 = AwaitCommon(this,cond,t);
  if (bVar1) {
    return true;
  }
  if (t.ns_ != 0) {
    return false;
  }
  raw_logging_internal::RawLog
            (kFatal,"mutex.cc",0x626,"Check %s failed: %s","res || t.has_timeout()",
             "condition untrue on return from Await");
  return false;
}

Assistant:

bool Mutex::AwaitWithDeadline(const Condition &cond, absl::Time deadline) {
  if (cond.Eval()) {      // condition already true; nothing to do
    if (kDebugMode) {
      this->AssertReaderHeld();
    }
    return true;
  }

  KernelTimeout t{deadline};
  bool res = this->AwaitCommon(cond, t);
  ABSL_RAW_CHECK(res || t.has_timeout(),
                 "condition untrue on return from Await");
  return res;
}